

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
V2Transport::GetMessageType_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,V2Transport *this,Span<const_unsigned_char> *contents)

{
  long *plVar1;
  byte bVar2;
  _func_int **pp_Var3;
  ulong uVar4;
  long in_FS_OFFSET;
  long *local_48;
  size_type local_40;
  long local_38;
  undefined8 uStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = *(ulong *)&(this->m_cipher).m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>
                     ._M_payload.super__Optional_payload<FSChaCha20,_true,_false,_false>.
                     super__Optional_payload_base<FSChaCha20>._M_payload;
  if (uVar4 == 0) {
LAB_008ba001:
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
  }
  else {
    pp_Var3 = (this->super_Transport)._vptr_Transport;
    bVar2 = *(byte *)pp_Var3;
    pp_Var3 = (_func_int **)((long)pp_Var3 + 1);
    (this->super_Transport)._vptr_Transport = pp_Var3;
    *(ulong *)&(this->m_cipher).m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>.
               _M_payload.super__Optional_payload<FSChaCha20,_true,_false,_false>.
               super__Optional_payload_base<FSChaCha20>._M_payload = uVar4 - 1;
    if (bVar2 == 0) {
      if (uVar4 < 0xd) goto LAB_008ba001;
      uVar4 = 0;
      do {
        if (*(byte *)((long)pp_Var3 + uVar4) == 0) goto LAB_008ba028;
        if ((char)*(byte *)((long)pp_Var3 + uVar4) < ' ') goto LAB_008ba001;
        uVar4 = uVar4 + 1;
      } while (uVar4 != 0xc);
      uVar4 = 0xc;
LAB_008ba028:
      local_48 = &local_38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,pp_Var3,(byte *)((long)pp_Var3 + uVar4));
      pp_Var3 = (this->super_Transport)._vptr_Transport;
      if (uVar4 < 0xc) {
        do {
          if (*(char *)((long)pp_Var3 + uVar4) != '\0') {
            (__return_storage_ptr__->
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged = false;
            if (local_48 != &local_38) {
              operator_delete(local_48,local_38 + 1);
            }
            goto LAB_008ba096;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != 0xc);
      }
      (this->super_Transport)._vptr_Transport = (_func_int **)((long)pp_Var3 + 0xc);
      *(long *)&(this->m_cipher).m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>.
                _M_payload.super__Optional_payload<FSChaCha20,_true,_false,_false>.
                super__Optional_payload_base<FSChaCha20>._M_payload =
           *(long *)&(this->m_cipher).m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>
                     ._M_payload.super__Optional_payload<FSChaCha20,_true,_false,_false>.
                     super__Optional_payload_base<FSChaCha20>._M_payload + -0xc;
      plVar1 = (long *)((long)&(__return_storage_ptr__->
                               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                               )._M_payload.
                               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ._M_payload + 0x10);
      *(long **)&(__return_storage_ptr__->
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload = plVar1;
      if (local_48 == &local_38) {
        *plVar1 = local_38;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload + 0x18) = uStack_30;
      }
      else {
        *(long **)&(__return_storage_ptr__->
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   )._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload = local_48;
        *(long *)((long)&(__return_storage_ptr__->
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload + 0x10) = local_38;
      }
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_string_length = local_40;
    }
    else {
      if (0x20 < bVar2) goto LAB_008ba001;
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p =
           (pointer)((long)&(__return_storage_ptr__->
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            )._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,
                 *(long *)((anonymous_namespace)::V2_MESSAGE_IDS_abi_cxx11_ + (ulong)bVar2 * 0x20),
                 *(long *)((anonymous_namespace)::V2_MESSAGE_IDS_abi_cxx11_ +
                          (ulong)bVar2 * 0x20 + 8) +
                 *(long *)((anonymous_namespace)::V2_MESSAGE_IDS_abi_cxx11_ + (ulong)bVar2 * 0x20));
    }
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = true;
  }
LAB_008ba096:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::string> V2Transport::GetMessageType(Span<const uint8_t>& contents) noexcept
{
    if (contents.size() == 0) return std::nullopt; // Empty contents
    uint8_t first_byte = contents[0];
    contents = contents.subspan(1); // Strip first byte.

    if (first_byte != 0) {
        // Short (1 byte) encoding.
        if (first_byte < std::size(V2_MESSAGE_IDS)) {
            // Valid short message id.
            return V2_MESSAGE_IDS[first_byte];
        } else {
            // Unknown short message id.
            return std::nullopt;
        }
    }

    if (contents.size() < CMessageHeader::COMMAND_SIZE) {
        return std::nullopt; // Long encoding needs 12 message type bytes.
    }

    size_t msg_type_len{0};
    while (msg_type_len < CMessageHeader::COMMAND_SIZE && contents[msg_type_len] != 0) {
        // Verify that message type bytes before the first 0x00 are in range.
        if (contents[msg_type_len] < ' ' || contents[msg_type_len] > 0x7F) {
            return {};
        }
        ++msg_type_len;
    }
    std::string ret{reinterpret_cast<const char*>(contents.data()), msg_type_len};
    while (msg_type_len < CMessageHeader::COMMAND_SIZE) {
        // Verify that message type bytes after the first 0x00 are also 0x00.
        if (contents[msg_type_len] != 0) return {};
        ++msg_type_len;
    }
    // Strip message type bytes of contents.
    contents = contents.subspan(CMessageHeader::COMMAND_SIZE);
    return ret;
}